

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void archive_write_pax_header_xattr(pax *pax,char *encoded_name,void *value,size_t value_len)

{
  char *value_00;
  char *encoded_value;
  archive_string s;
  size_t value_len_local;
  void *value_local;
  char *encoded_name_local;
  pax *pax_local;
  
  s.buffer_length = value_len;
  if ((pax->flags & 2) != 0) {
    value_00 = base64_encode((char *)value,value_len);
    if ((encoded_name != (char *)0x0) && (value_00 != (char *)0x0)) {
      encoded_value = (char *)0x0;
      s.length = 0;
      s.s = (char *)0x0;
      archive_strncat((archive_string *)&encoded_value,"LIBARCHIVE.xattr.",0x11);
      archive_strcat((archive_string *)&encoded_value,encoded_name);
      add_pax_attr(&pax->pax_header,encoded_value,value_00);
      archive_string_free((archive_string *)&encoded_value);
    }
    free(value_00);
  }
  if ((pax->flags & 1) != 0) {
    encoded_value = (char *)0x0;
    s.length = 0;
    s.s = (char *)0x0;
    archive_strncat((archive_string *)&encoded_value,"SCHILY.xattr.",0xd);
    archive_strcat((archive_string *)&encoded_value,encoded_name);
    add_pax_attr_binary(&pax->pax_header,encoded_value,(char *)value,s.buffer_length);
    archive_string_free((archive_string *)&encoded_value);
  }
  return;
}

Assistant:

static void
archive_write_pax_header_xattr(struct pax *pax, const char *encoded_name,
    const void *value, size_t value_len)
{
	struct archive_string s;
	char *encoded_value;

	if (pax->flags & WRITE_LIBARCHIVE_XATTR) {
		encoded_value = base64_encode((const char *)value, value_len);

		if (encoded_name != NULL && encoded_value != NULL) {
			archive_string_init(&s);
			archive_strcpy(&s, "LIBARCHIVE.xattr.");
			archive_strcat(&s, encoded_name);
			add_pax_attr(&(pax->pax_header), s.s, encoded_value);
			archive_string_free(&s);
		}
		free(encoded_value);
	}
	if (pax->flags & WRITE_SCHILY_XATTR) {
		archive_string_init(&s);
		archive_strcpy(&s, "SCHILY.xattr.");
		archive_strcat(&s, encoded_name);
		add_pax_attr_binary(&(pax->pax_header), s.s, value, value_len);
		archive_string_free(&s);
	}
}